

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line.c
# Opt level: O0

int dwarf_srclines_table_offset
              (Dwarf_Line_Context line_context,Dwarf_Unsigned *offset,Dwarf_Error *error)

{
  Dwarf_Error *error_local;
  Dwarf_Unsigned *offset_local;
  Dwarf_Line_Context line_context_local;
  
  if (line_context == (Dwarf_Line_Context)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x131);
    line_context_local._4_4_ = 1;
  }
  else if (line_context->lc_magic == 0xd00d1111) {
    *offset = line_context->lc_section_offset;
    line_context_local._4_4_ = 0;
  }
  else {
    _dwarf_error((Dwarf_Debug)0x0,error,0x131);
    line_context_local._4_4_ = 1;
  }
  return line_context_local._4_4_;
}

Assistant:

int
dwarf_srclines_table_offset(Dwarf_Line_Context line_context,
    Dwarf_Unsigned * offset,
    Dwarf_Error  *    error)
{
    if (!line_context ){
        _dwarf_error(NULL, error, DW_DLE_LINE_CONTEXT_BOTCH);
        return DW_DLV_ERROR;
    }
    if ( line_context->lc_magic != DW_CONTEXT_MAGIC) {
        _dwarf_error(NULL, error,
            DW_DLE_LINE_CONTEXT_BOTCH);
        return DW_DLV_ERROR;
    }
    *offset = line_context->lc_section_offset;
    return DW_DLV_OK;
}